

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

int __thiscall APowerInvisibility::AlterWeaponSprite(APowerInvisibility *this,visstyle_t *vis)

{
  bool bVar1;
  int iVar2;
  AInventory *pAVar3;
  FSpecialColormap *pFVar4;
  float fVar5;
  int local_34;
  float ts;
  int changed;
  visstyle_t *vis_local;
  APowerInvisibility *this_local;
  
  bVar1 = TObjPtr<AInventory>::operator==
                    (&(this->super_APowerup).super_AInventory.super_AActor.Inventory,
                     (AInventory *)0x0);
  if (bVar1) {
    local_34 = 0;
  }
  else {
    pAVar3 = TObjPtr<AInventory>::operator->
                       (&(this->super_APowerup).super_AInventory.super_AActor.Inventory);
    local_34 = (*(pAVar3->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2e])
                         (pAVar3,vis);
  }
  if (((local_34 == 0) && (*(int *)&(this->super_APowerup).super_AInventory.field_0x4fc < 0x80)) &&
     ((*(uint *)&(this->super_APowerup).super_AInventory.field_0x4fc & 8) == 0)) {
    FRenderStyle::operator=((FRenderStyle *)&(vis->RenderStyle).field_0,STYLE_Normal);
    vis->Alpha = 1.0;
    return 1;
  }
  if (local_34 != 1) goto LAB_00685b8a;
  fVar5 = clamp<float>(1.0 - (float)(((this->super_APowerup).Strength / 100.0) *
                                    (double)((this->super_APowerup).super_AInventory.super_AActor.
                                             special1 + 1)),0.0,1.0);
  vis->Alpha = fVar5;
  iVar2 = FName::operator_cast_to_int(&(this->super_APowerup).Mode.super_FName);
  if (iVar2 != 0) {
    if (iVar2 == 0x13) {
      FRenderStyle::operator=((FRenderStyle *)&(vis->RenderStyle).field_0,STYLE_Add);
      goto LAB_00685b8a;
    }
    if (iVar2 != 0x14) {
      if (iVar2 == 0x15) {
        FRenderStyle::operator=((FRenderStyle *)&(vis->RenderStyle).field_0,STYLE_OptFuzzy);
        goto LAB_00685b8a;
      }
      if (iVar2 == 0x16) {
        FRenderStyle::operator=((FRenderStyle *)&(vis->RenderStyle).field_0,STYLE_Normal);
        goto LAB_00685b8a;
      }
      if (iVar2 == 0x17) {
        FRenderStyle::operator=((FRenderStyle *)&(vis->RenderStyle).field_0,STYLE_Stencil);
        goto LAB_00685b8a;
      }
      if (iVar2 == 0x18) {
        FRenderStyle::operator=((FRenderStyle *)&(vis->RenderStyle).field_0,STYLE_AddStencil);
        goto LAB_00685b8a;
      }
      if (iVar2 == 0x1f) {
        FRenderStyle::operator=
                  ((FRenderStyle *)&(vis->RenderStyle).field_0,STYLE_TranslucentStencil);
        goto LAB_00685b8a;
      }
    }
  }
  FRenderStyle::operator=((FRenderStyle *)&(vis->RenderStyle).field_0,STYLE_Translucent);
LAB_00685b8a:
  if (((vis->Alpha <= 0.25 && vis->Alpha != 0.25) &&
      (0 < (this->super_APowerup).super_AInventory.super_AActor.special1)) ||
     ((vis->Alpha == 0.0 && (!NAN(vis->Alpha))))) {
    fVar5 = clamp<float>(1.0 - (float)((this->super_APowerup).Strength / 100.0),0.0,1.0);
    vis->Alpha = fVar5;
    pFVar4 = TArray<FSpecialColormap,_FSpecialColormap>::operator[](&SpecialColormaps,0);
    vis->colormap = pFVar4->Colormap;
  }
  return -1;
}

Assistant:

int APowerInvisibility::AlterWeaponSprite (visstyle_t *vis)
{
	int changed = Inventory == NULL ? false : Inventory->AlterWeaponSprite(vis);
	// Blink if the powerup is wearing off
	if (changed == 0 && EffectTics < 4*32 && !(EffectTics & 8))
	{
		vis->RenderStyle = STYLE_Normal;
		vis->Alpha = 1.f;
		return 1;
	}
	else if (changed == 1)
	{
		// something else set the weapon sprite back to opaque but this item is still active.
		float ts = float((Strength / 100) * (special1 + 1));
		vis->Alpha = clamp<>((1.f - ts), 0.f, 1.f);
		switch (Mode)
		{
		case (NAME_Fuzzy):
			vis->RenderStyle = STYLE_OptFuzzy;
			break;
		case (NAME_Opaque):
			vis->RenderStyle = STYLE_Normal;
			break;
		case (NAME_Additive):
			vis->RenderStyle = STYLE_Add;
			break;
		case (NAME_Stencil):
			vis->RenderStyle = STYLE_Stencil;
			break;
		case (NAME_TranslucentStencil) :
			vis->RenderStyle = STYLE_TranslucentStencil;
			break;
		case (NAME_AddStencil) :
			vis->RenderStyle = STYLE_AddStencil;
			break;
		case (NAME_None) :
		case (NAME_Cumulative):
		case (NAME_Translucent):
		default:
			vis->RenderStyle = STYLE_Translucent;
			break;
		}
	}
	// Handling of Strife-like cumulative invisibility powerups, the weapon itself shouldn't become invisible
	if ((vis->Alpha < 0.25f && special1 > 0) || (vis->Alpha == 0))
	{
		vis->Alpha = clamp((1.f - float(Strength/100)), 0.f, 1.f);
		vis->colormap = SpecialColormaps[INVERSECOLORMAP].Colormap;
	}
	return -1;	// This item is valid so another one shouldn't reset the translucency
}